

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateArraySetup(ExpressionTranslateContext *ctx,ExprArraySetup *expression)

{
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  
  pTVar1 = expression->lhs->type;
  if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
    pTVar1 = (TypeBase *)0x0;
  }
  if (pTVar1 == (TypeBase *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                  ,0x4e3,"void TranslateArraySetup(ExpressionTranslateContext &, ExprArraySetup *)")
    ;
  }
  pp_Var2 = pTVar1[1]._vptr_TypeBase;
  if ((pp_Var2 == (_func_int **)0x0) || (*(int *)(pp_Var2 + 1) != 0x13)) {
    pp_Var2 = (_func_int **)0x0;
  }
  if (pp_Var2 != (_func_int **)0x0) {
    Print(ctx,"__nullcSetupArray((");
    Translate(ctx,expression->lhs);
    Print(ctx,")->ptr, %u, ",(ulong)*(uint *)(pp_Var2 + 0xd));
    Translate(ctx,expression->initializer);
    Print(ctx,")");
    return;
  }
  __assert_fail("arrayType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                ,0x4e7,"void TranslateArraySetup(ExpressionTranslateContext &, ExprArraySetup *)");
}

Assistant:

void TranslateArraySetup(ExpressionTranslateContext &ctx, ExprArraySetup *expression)
{
	TypeRef *refType = getType<TypeRef>(expression->lhs->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	Print(ctx, "__nullcSetupArray((");
	Translate(ctx, expression->lhs);
	Print(ctx, ")->ptr, %u, ", (unsigned)arrayType->length);
	Translate(ctx, expression->initializer);
	Print(ctx, ")");
}